

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSchemas.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  __off_t __len;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  void *__addr;
  long lVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  char **ppcVar11;
  ulong uVar12;
  bool bVar13;
  stat info;
  int local_d4;
  stat64 local_c0;
  
  if (1 < argc) {
    local_d4 = noout;
    uVar12 = 1;
    iVar10 = memory;
    iVar3 = debug;
    do {
      pcVar9 = argv[uVar12];
      iVar2 = strcmp(pcVar9,"-debug");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar9,"--debug"), iVar2 == 0)) {
        debug = iVar3 + 1;
        iVar3 = debug;
      }
      else {
        iVar2 = strcmp(pcVar9,"-memory");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcVar9,"--memory"), iVar2 == 0)) {
          iVar10 = iVar10 + 1;
          memory = iVar10;
        }
        else {
          iVar2 = strcmp(pcVar9,"-noout");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar9,"--noout"), iVar2 == 0)) {
            noout = local_d4 + 1;
            local_d4 = noout;
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while ((uint)argc != uVar12);
  }
  xmlLineNumbersDefault(1);
  if (argc < 2) {
    bVar13 = true;
    lVar7 = 0;
  }
  else {
    lVar8 = (ulong)(uint)argc - 1;
    iVar10 = 0;
    lVar7 = 0;
    ppcVar11 = argv;
    do {
      ppcVar11 = ppcVar11 + 1;
      pcVar9 = *ppcVar11;
      if (*pcVar9 != '-') {
        if (lVar7 == 0) {
          if (memory == 0) {
            uVar5 = xmlSchemaNewParserCtxt();
            puVar6 = (undefined8 *)__xmlGenericError();
            uVar1 = *puVar6;
            puVar6 = (undefined8 *)__xmlGenericError();
            xmlSchemaSetParserErrors(uVar5,uVar1,*puVar6,0);
            lVar7 = xmlSchemaParse(uVar5);
            xmlSchemaFreeParserCtxt(uVar5);
LAB_001015d1:
            if (debug != 0) {
              xmlSchemaDump(_stdout,lVar7);
            }
            iVar3 = (uint)(lVar7 == 0) << 3;
          }
          else {
            iVar2 = stat64(pcVar9,&local_c0);
            iVar3 = 5;
            if (iVar2 < 0) {
              lVar7 = 0;
              bVar13 = false;
            }
            else {
              bVar13 = false;
              iVar2 = open64(*ppcVar11,0);
              __len = local_c0.st_size;
              if (iVar2 < 0) {
                lVar7 = 0;
              }
              else {
                __addr = mmap64((void *)0x0,local_c0.st_size,1,1,iVar2,0);
                if (__addr == (void *)0xffffffffffffffff) {
                  lVar7 = 0;
                  iVar3 = 5;
                }
                else {
                  uVar5 = xmlSchemaNewMemParserCtxt(__addr,__len & 0xffffffff);
                  puVar6 = (undefined8 *)__xmlGenericError();
                  uVar1 = *puVar6;
                  puVar6 = (undefined8 *)__xmlGenericError();
                  xmlSchemaSetParserErrors(uVar5,uVar1,*puVar6,0);
                  lVar7 = xmlSchemaParse(uVar5);
                  xmlSchemaFreeParserCtxt(uVar5);
                  munmap(__addr,__len);
                  iVar3 = 0;
                }
                bVar13 = __addr != (void *)0xffffffffffffffff;
              }
            }
            if (bVar13) goto LAB_001015d1;
          }
          if (iVar3 != 0) {
            if (iVar3 != 5) {
              if (iVar3 != 8) {
                return 0;
              }
              goto LAB_00101676;
            }
            break;
          }
        }
        else {
          lVar4 = xmlReadFile(pcVar9,0,0);
          if (lVar4 == 0) {
            main_cold_1();
          }
          else {
            uVar5 = xmlSchemaNewValidCtxt(lVar7);
            puVar6 = (undefined8 *)__xmlGenericError();
            uVar1 = *puVar6;
            puVar6 = (undefined8 *)__xmlGenericError();
            xmlSchemaSetValidErrors(uVar5,uVar1,*puVar6);
            iVar3 = xmlSchemaValidateDoc(uVar5,lVar4);
            if (iVar3 == 0) {
              pcVar9 = "%s validates\n";
            }
            else if (iVar3 < 1) {
              pcVar9 = "%s validation generated an internal error\n";
            }
            else {
              pcVar9 = "%s fails to validate\n";
            }
            printf(pcVar9);
            xmlSchemaFreeValidCtxt(uVar5);
            xmlFreeDoc(lVar4);
          }
        }
        iVar10 = iVar10 + 1;
      }
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    bVar13 = iVar10 == 0;
  }
  if (lVar7 != 0) {
    xmlSchemaFree(lVar7);
  }
  if (bVar13) {
    printf("Usage : %s [--debug] [--noout] schemas XMLfiles ...\n",*argv);
    puts("\tParse the HTML files and output the result of the parsing");
    puts("\t--debug : dump a debug tree of the in-memory document");
    puts("\t--noout : do not print the result");
    puts("\t--memory : test the schemas in memory parsing");
  }
LAB_00101676:
  xmlSchemaCleanupTypes();
  xmlCleanupParser();
  xmlMemoryDump();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int files = 0;
    xmlSchemaPtr schema = NULL;

    for (i = 1; i < argc ; i++) {
#ifdef LIBXML_DEBUG_ENABLED
	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug")))
	    debug++;
	else
#endif
#ifdef HAVE_MMAP
	if ((!strcmp(argv[i], "-memory")) || (!strcmp(argv[i], "--memory"))) {
	    memory++;
        } else
#endif
	if ((!strcmp(argv[i], "-noout")) || (!strcmp(argv[i], "--noout"))) {
	    noout++;
        }
    }
    xmlLineNumbersDefault(1);
    for (i = 1; i < argc ; i++) {
	if (argv[i][0] != '-') {
	    if (schema == NULL) {
		xmlSchemaParserCtxtPtr ctxt;

#ifdef HAVE_MMAP
		if (memory) {
		    int fd;
		    struct stat info;
		    const char *base;
		    if (stat(argv[i], &info) < 0)
			break;
		    if ((fd = open(argv[i], O_RDONLY)) < 0)
			break;
		    base = mmap(NULL, info.st_size, PROT_READ,
			        MAP_SHARED, fd, 0) ;
		    if (base == (void *) MAP_FAILED)
			break;

		    ctxt = xmlSchemaNewMemParserCtxt((char *)base,info.st_size);

		    xmlSchemaSetParserErrors(ctxt,
                            xmlGenericError, xmlGenericError, NULL);
		    schema = xmlSchemaParse(ctxt);
		    xmlSchemaFreeParserCtxt(ctxt);
		    munmap((char *) base, info.st_size);
		} else
#endif
		{
		    ctxt = xmlSchemaNewParserCtxt(argv[i]);
		    xmlSchemaSetParserErrors(ctxt,
                            xmlGenericError, xmlGenericError, NULL);
		    schema = xmlSchemaParse(ctxt);
		    xmlSchemaFreeParserCtxt(ctxt);
		}
#ifdef LIBXML_OUTPUT_ENABLED
#ifdef LIBXML_DEBUG_ENABLED
		if (debug)
		    xmlSchemaDump(stdout, schema);
#endif
#endif /* LIBXML_OUTPUT_ENABLED */
		if (schema == NULL)
		    goto failed_schemas;
	    } else {
		xmlDocPtr doc;

		doc = xmlReadFile(argv[i],NULL,0);

		if (doc == NULL) {
		    fprintf(stderr, "Could not parse %s\n", argv[i]);
		} else {
		    xmlSchemaValidCtxtPtr ctxt;
		    int ret;

		    ctxt = xmlSchemaNewValidCtxt(schema);
		    xmlSchemaSetValidErrors(ctxt,
                            xmlGenericError, xmlGenericError, NULL);
		    ret = xmlSchemaValidateDoc(ctxt, doc);
		    if (ret == 0) {
			printf("%s validates\n", argv[i]);
		    } else if (ret > 0) {
			printf("%s fails to validate\n", argv[i]);
		    } else {
			printf("%s validation generated an internal error\n",
			       argv[i]);
		    }
		    xmlSchemaFreeValidCtxt(ctxt);
		    xmlFreeDoc(doc);
		}
	    }
	    files ++;
	}
    }
    if (schema != NULL)
	xmlSchemaFree(schema);
    if (files == 0) {
	printf("Usage : %s [--debug] [--noout] schemas XMLfiles ...\n",
	       argv[0]);
	printf("\tParse the HTML files and output the result of the parsing\n");
#ifdef LIBXML_DEBUG_ENABLED
	printf("\t--debug : dump a debug tree of the in-memory document\n");
#endif
	printf("\t--noout : do not print the result\n");
#ifdef HAVE_MMAP
	printf("\t--memory : test the schemas in memory parsing\n");
#endif
    }
failed_schemas:
    xmlSchemaCleanupTypes();
    xmlCleanupParser();
    xmlMemoryDump();

    return(0);
}